

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::LineWidthParamTestInstance::iterate
          (TestStatus *__return_storage_ptr__,LineWidthParamTestInstance *this)

{
  Context *this_00;
  DeviceInterface *pDVar1;
  Image *this_01;
  double dVar2;
  TestStatus *pTVar3;
  bool bVar4;
  VkResult result;
  VkQueue pVVar5;
  InstanceInterface *pIVar6;
  VkPhysicalDevice pVVar7;
  Allocator *allocator;
  int iVar8;
  int y;
  int x;
  int x_00;
  int iVar9;
  float fVar10;
  allocator<char> local_4bd;
  float local_4bc;
  undefined8 local_4b8;
  undefined4 local_4b0;
  TestStatus *local_4a8;
  TestLog *local_4a0;
  VkQueue local_498;
  double local_490;
  double local_488;
  double local_480;
  string local_478 [32];
  ConstPixelBufferAccess renderedFrame;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Texture2D referenceFrame;
  VkSubmitInfo submitInfo;
  VkPhysicalDeviceProperties deviceProperties;
  
  this_00 = (this->super_DynamicStateBaseClass).super_TestInstance.m_context;
  local_4a0 = this_00->m_testCtx->m_log;
  local_4a8 = __return_storage_ptr__;
  pVVar5 = Context::getUniversalQueue(this_00);
  DynamicStateBaseClass::beginRenderPass(&this->super_DynamicStateBaseClass);
  pIVar6 = Context::getInstanceInterface
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  pVVar7 = Context::getPhysicalDevice
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  (*pIVar6->_vptr_InstanceInterface[5])(pIVar6,pVVar7,&deviceProperties);
  DynamicStateBaseClass::setDynamicViewportState(&this->super_DynamicStateBaseClass,0x80,0x80);
  DynamicStateBaseClass::setDynamicBlendState(&this->super_DynamicStateBaseClass,0.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            (&this->super_DynamicStateBaseClass,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,
             0xffffffff,0);
  fVar10 = floorf(deviceProperties.limits.lineWidthRange[1]);
  DynamicStateBaseClass::setDynamicRasterizationState
            (&this->super_DynamicStateBaseClass,fVar10,0.0,0.0,0.0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DynamicStateBaseClass).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x58])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)((long)(this->super_DynamicStateBaseClass).m_data.
                           super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_DynamicStateBaseClass).m_data.
                          super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5,1,0,0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x76])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4a])
            (pDVar1,(this->super_DynamicStateBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,pVVar5,1);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  local_498 = pVVar5;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,pVVar5);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateRSTests.cpp"
                    ,0x290);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DynamicStateBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x80,0x80);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  local_480 = (double)referenceFrame.m_height;
  local_490 = local_480 * 0.5;
  y = 0;
  iVar8 = referenceFrame.m_width;
  if (referenceFrame.m_width < 1) {
    iVar8 = 0;
  }
  local_488 = (double)referenceFrame.m_width * 0.5;
  iVar9 = referenceFrame.m_height;
  if (referenceFrame.m_height < 1) {
    iVar9 = 0;
  }
  for (; y != iVar9; y = y + 1) {
    local_4bc = (float)((double)y / local_490) + -1.0;
    for (x_00 = 0; iVar8 != x_00; x_00 = x_00 + 1) {
      dVar2 = (double)x_00 / local_488;
      fVar10 = floorf(deviceProperties.limits.lineWidthRange[1]);
      if ((local_4bc <= (float)((double)fVar10 / local_480)) && (ABS((float)dVar2 + -1.0) <= 1.0)) {
        if (-(float)((double)fVar10 / local_480) <= local_4bc) {
          renderedFrame.m_format.order = R;
          renderedFrame.m_format.type = 0x3f800000;
          renderedFrame.m_size.m_data[0] = 0;
          renderedFrame.m_size.m_data[1] = 0x3f800000;
          tcu::PixelBufferAccess::setPixel
                    (referenceFrame.super_TextureLevelPyramid.m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x_00,y,0);
        }
      }
    }
  }
  this_01 = (this->super_DynamicStateBaseClass).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  local_4b0 = 0;
  local_4b8 = 0;
  Draw::Image::readSurface
            (&renderedFrame,this_01,local_498,allocator,VK_IMAGE_LAYOUT_GENERAL,
             (VkOffset3D)(ZEXT412(0) << 0x40),0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar4 = tcu::fuzzyCompare(local_4a0,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  pTVar3 = local_4a8;
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_478,"Image verification passed",&local_4bd);
    pTVar3->m_code = QP_TEST_RESULT_PASS;
    std::__cxx11::string::string((string *)&pTVar3->m_description,local_478);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_478,"Image verification failed",&local_4bd);
    pTVar3->m_code = QP_TEST_RESULT_FAIL;
    std::__cxx11::string::string((string *)&pTVar3->m_description,local_478);
  }
  std::__cxx11::string::~string(local_478);
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar3;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log		= m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// set states here
		vk::VkPhysicalDeviceProperties deviceProperties;
		m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &deviceProperties);

		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicBlendState();
		setDynamicDepthStencilState();
		setDynamicRasterizationState(deFloatFloor(deviceProperties.limits.lineWidthRange[1]));

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		const vk::VkDeviceSize vertexBufferOffset	= 0;
		const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		m_vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_data.size()), 1, 0, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// validation
		{
			VK_CHECK(m_vk.queueWaitIdle(queue));

			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

			for (int y = 0; y < frameHeight; y++)
			{
				float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;
					float lineHalfWidth = (float)(deFloor(deviceProperties.limits.lineWidthRange[1]) / frameHeight);

					if (xCoord >= -1.0f && xCoord <= 1.0f && yCoord >= -lineHalfWidth && yCoord <= lineHalfWidth)
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
																							  vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT,
																							  vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}